

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O3

bool __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>::
rec_equal<Gudhi::Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>,boost::container::flat_map<short,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>>,std::less<short>,void>>>
          (Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence> *this,
          Siblings *s1,
          Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>,_boost::container::flat_map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>,_std::less<short>,_void>_>
          *s2)

{
  short sVar1;
  short sVar2;
  pointer __s1;
  pointer piVar3;
  void *__s2;
  Siblings *s1_00;
  Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>,_boost::container::flat_map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>,_std::less<short>,_void>_>
  *s2_00;
  bool bVar4;
  int iVar5;
  size_t __n;
  stored_size_type sVar6;
  pointer ppVar7;
  pointer ppVar8;
  pointer ppVar9;
  
  sVar6 = (s1->members_).m_flat_tree.m_data.m_seq.m_holder.m_size;
  if (sVar6 == (s2->members_).m_flat_tree.m_data.m_seq.m_holder.m_size) {
    bVar4 = true;
    if (sVar6 != 0) {
      ppVar7 = (s1->members_).m_flat_tree.m_data.m_seq.m_holder.m_start;
      ppVar8 = (s2->members_).m_flat_tree.m_data.m_seq.m_holder.m_start;
      ppVar9 = ppVar7;
      do {
        if (ppVar8 == (s2->members_).m_flat_tree.m_data.m_seq.m_holder.m_start +
                      (s2->members_).m_flat_tree.m_data.m_seq.m_holder.m_size) break;
        sVar1 = ppVar7->first;
        if (sVar1 != ppVar8->first) goto LAB_0012a1b7;
        __s1 = *(pointer *)&(ppVar7->second).super_Filtration_simplex_base.filt_;
        piVar3 = *(pointer *)((long)&(ppVar7->second).super_Filtration_simplex_base + 8);
        __n = (long)piVar3 - (long)__s1;
        __s2 = *(void **)&(ppVar8->second).super_Filtration_simplex_base.filt_;
        if (__n != (long)*(pointer *)((long)&(ppVar8->second).super_Filtration_simplex_base + 8) -
                   (long)__s2) goto LAB_0012a1b7;
        if (piVar3 != __s1) {
          iVar5 = bcmp(__s1,__s2,__n);
          if (iVar5 != 0) goto LAB_0012a1b7;
        }
        s1_00 = (ppVar7->second).children_;
        sVar2 = s1_00->parent_;
        s2_00 = (ppVar8->second).children_;
        if ((s2_00->parent_ == sVar1) != (sVar2 == sVar1)) goto LAB_0012a1b7;
        if (sVar2 == sVar1) {
          bVar4 = rec_equal<Gudhi::Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>,boost::container::flat_map<short,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>>,std::less<short>,void>>>
                            (this,s1_00,s2_00);
          if (!bVar4) goto LAB_0012a1b7;
          ppVar9 = (s1->members_).m_flat_tree.m_data.m_seq.m_holder.m_start;
          sVar6 = (s1->members_).m_flat_tree.m_data.m_seq.m_holder.m_size;
        }
        ppVar7 = ppVar7 + 1;
        ppVar8 = ppVar8 + 1;
      } while (ppVar7 != ppVar9 + sVar6);
      bVar4 = true;
    }
  }
  else {
LAB_0012a1b7:
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool rec_equal(Siblings const* s1, OtherSiblings const* s2) const {
    if (s1->members().size() != s2->members().size())
      return false;
    auto sh2 = s2->members().begin();
    for (auto sh1 = s1->members().begin();
         (sh1 != s1->members().end() && sh2 != s2->members().end());
         ++sh1, ++sh2) {
      if (sh1->first != sh2->first || !(sh1->second.filtration() == sh2->second.filtration()))
        return false;
      if (has_children(sh1) != has_children(sh2))
        return false;
      // Recursivity on children only if both have children
      else if (has_children(sh1))
        if (!rec_equal(sh1->second.children(), sh2->second.children()))
          return false;
    }
    return true;
  }